

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<float>
          (options_serializer_boost_po *this,
          typed_option<std::vector<float,_std::allocator<float>_>_> *typed_option)

{
  bool bVar1;
  size_type sVar2;
  reference pfVar3;
  typed_option<std::vector<float,_std::allocator<float>_>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float *value;
  iterator __end0;
  iterator __begin0;
  vector<float,_std::allocator<float>_> *__range4;
  vector<float,_std::allocator<float>_> vec;
  ostream *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_38;
  vector<float,_std::allocator<float>_> *local_30;
  vector<float,_std::allocator<float>_> local_28;
  
  typed_option<std::vector<float,_std::allocator<float>_>_>::value(in_RSI);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(&local_28);
  if (sVar2 != 0) {
    local_30 = &local_28;
    local_38._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff88);
    std::vector<float,_std::allocator<float>_>::end
              ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&local_38);
      in_stack_ffffffffffffff90 = std::operator<<((ostream *)(in_RDI + 1)," --");
      std::operator<<(in_stack_ffffffffffffff90,(string *)&(in_RSI->super_base_option).m_name);
      in_stack_ffffffffffffff88 = std::operator<<((ostream *)(in_RDI + 1)," ");
      std::ostream::operator<<(in_stack_ffffffffffffff88,*pfVar3);
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&local_38);
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector(in_RDI);
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>> typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }